

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.hpp
# Opt level: O3

void __thiscall
ot::commissioner::DtlsSession::DtlsTimer::DtlsTimer
          (DtlsTimer *this,event_base *aEventBase,Action *aAction)

{
  _Any_data _Stack_38;
  code *local_28;
  
  std::function<void_(ot::commissioner::Timer_&)>::function
            ((function<void_(ot::commissioner::Timer_&)> *)&_Stack_38,aAction);
  Timer::Timer(&this->super_Timer,aEventBase,(Action *)&_Stack_38,true);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  (this->mIntermediate).__d.__r = 0;
  this->mCancelled = false;
  return;
}

Assistant:

DtlsTimer(struct event_base *aEventBase, Action aAction)
            : Timer(aEventBase, aAction)
            , mCancelled(false)
        {
        }